

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O3

void __thiscall AGSSockAPI::Thread::start(Thread *this)

{
  int iVar1;
  Mutex *__mutex;
  
  if (this->data != (Data *)0x0) {
    __mutex = &this->data->mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (this->data->active == false) {
      iVar1 = pthread_create(&this->data->thread,(pthread_attr_t *)0x0,Data::Function,this);
      this->data->active = iVar1 == 0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  __assert_fail("data != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FTPlus[P]AGSsock/src/API.cpp"
                ,0xe2,"void AGSSockAPI::Thread::start()");
}

Assistant:

void Thread::start()
{
	assert(data != nullptr);

	{
		Mutex::Lock lock(data->mutex);

		if (!data->active)
		{
		#ifdef _WIN32
			data->handle = CreateThread(nullptr, 0,
				Data::Function, static_cast<LPVOID> (this), 0, nullptr);
			data->active = (data->handle != nullptr);
		#else
			data->active = !pthread_create(&data->thread, nullptr,
				Data::Function, static_cast<void *> (this));
		#endif
		}
	}
}